

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

Trivia __thiscall
slang::parsing::Preprocessor::handleDefineDirective(Preprocessor *this,Token directive)

{
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view rawText;
  string_view arg;
  string_view directive_00;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia_00;
  string_view rawText_00;
  bool bVar1;
  SyntaxKind SVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference peVar5;
  DefineDirectiveSyntax *syntax;
  basic_string_view<char,_std::char_traits<char>_> *args_1;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *peVar6;
  basic_string_view<char,_std::char_traits<char>_> *__x_00;
  pointer ppVar7;
  Info *pIVar8;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *extraout_RDX_01;
  long in_RDI;
  Token TVar9;
  Diagnostic *diag;
  iterator it;
  DefineDirectiveSyntax *result;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> nextTrivia;
  string_view raw;
  Trivia *trivia_1;
  iterator __end3;
  iterator __begin3;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> *__range3;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> triviaList;
  bool done;
  Token t;
  bool hasContinuation;
  MacroParser parser;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  bool isEscaped;
  Token name;
  bool bad;
  MacroFormalArgumentListSyntax *formalArguments;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  locator loc;
  size_t pos0;
  size_t hash_1;
  basic_string_view<char,_std::char_traits<char>_> *k;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  Preprocessor *in_stack_fffffffffffffa08;
  Diagnostic *in_stack_fffffffffffffa10;
  SourceLocation in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa20;
  DiagCode in_stack_fffffffffffffa24;
  SourceLocation in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa30;
  undefined4 uVar10;
  DiagCode in_stack_fffffffffffffa34;
  undefined4 uVar11;
  size_t in_stack_fffffffffffffa38;
  size_t pos0_00;
  Diagnostic *in_stack_fffffffffffffa40;
  BumpAllocator *in_stack_fffffffffffffa48;
  Token *in_stack_fffffffffffffa50;
  DefineDirectiveSyntax *this_00;
  undefined7 in_stack_fffffffffffffa58;
  undefined1 in_stack_fffffffffffffa5f;
  SourceLocation in_stack_fffffffffffffa60;
  pointer in_stack_fffffffffffffa68;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffa70;
  span<slang::parsing::Token,_18446744073709551615UL> *in_stack_fffffffffffffa80;
  SourceLocation args;
  MacroFormalArgumentListSyntax **in_stack_fffffffffffffa88;
  basic_string_view<char,_std::char_traits<char>_> *hash_00;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
  *in_stack_fffffffffffffa90;
  Token *in_stack_fffffffffffffa98;
  Preprocessor *in_stack_fffffffffffffaa0;
  DefineDirectiveSyntax *in_stack_fffffffffffffaa8;
  bool local_539;
  string_view local_530;
  MacroDef local_520;
  SourceLocation local_510;
  undefined4 local_504;
  string_view local_500;
  SourceRange local_4f0;
  undefined4 local_4dc;
  Diagnostic *local_4d8;
  SourceRange local_4d0;
  undefined4 local_4bc;
  iterator local_4b8;
  MacroParser *local_4a8;
  MacroParser *this_01;
  Preprocessor *local_458;
  Diagnostic *local_450;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_3f8;
  string_view local_3e8;
  Token local_3d8;
  string_view local_3c8;
  reference local_3b8;
  Trivia *local_3b0;
  __normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
  local_3a8;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> *local_3a0;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_398;
  byte local_381;
  Token local_380;
  Token local_370;
  byte local_359;
  basic_string_view<char,_std::char_traits<char>_> local_338;
  string_view local_328;
  Token local_318;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_308;
  string_view local_2f8;
  string_view local_2e8;
  bool local_2d1;
  SourceRange local_2d0;
  undefined4 local_2bc;
  string_view local_2b8;
  Token local_2a8;
  Token local_298;
  Token local_288;
  Token local_278;
  byte local_261;
  MacroFormalArgumentListSyntax *local_260;
  Trivia local_240;
  SourceLocation local_230;
  basic_string_view<char,_std::char_traits<char>_> *local_228;
  char_pointer local_220;
  table_element_pointer local_218;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_210;
  string_view *local_1f8;
  basic_string_view<char,_std::char_traits<char>_> *local_1f0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>
  local_1e8;
  SourceLocation local_1d0;
  basic_string_view<char,_std::char_traits<char>_> *local_1c8;
  iterator local_1c0;
  size_t local_1b0;
  SourceLocation local_1a8;
  basic_string_view<char,_std::char_traits<char>_> *local_1a0;
  uint local_194;
  value_type *local_190;
  value_type *local_188;
  uint local_17c;
  group_type *local_178;
  size_t local_170;
  pow2_quadratic_prober local_168;
  size_t local_158;
  size_t local_150;
  SourceLocation local_148;
  basic_string_view<char,_std::char_traits<char>_> *local_140;
  undefined1 local_131;
  string_view *local_130;
  basic_string_view<char,_std::char_traits<char>_> *local_128;
  bool local_119 [25];
  iterator local_100;
  bool local_e9 [25];
  iterator local_d0;
  bool local_b9;
  iterator local_b8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>
  local_a8;
  size_t local_90;
  size_t local_88;
  basic_string_view<char,_std::char_traits<char>_> *local_80;
  string_view *local_78;
  undefined1 *local_70;
  basic_string_view<char,_std::char_traits<char>_> *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  basic_string_view<char,_std::char_traits<char>_> *local_10;
  size_t local_8;
  
  local_260 = (MacroFormalArgumentListSyntax *)0x0;
  local_261 = 0;
  this_01 = local_4a8;
  Token::Token((Token *)in_stack_fffffffffffffa10);
  local_288 = peek((Preprocessor *)in_stack_fffffffffffffa18);
  bVar1 = LexerFacts::isKeyword(local_288.kind);
  if (bVar1) {
    TVar9 = consume((Preprocessor *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
    local_298._0_8_ = TVar9._0_8_;
    local_278.kind = local_298.kind;
    local_278._2_1_ = local_298._2_1_;
    local_278.numFlags.raw = local_298.numFlags.raw;
    local_278.rawLen = local_298.rawLen;
    local_298.info = TVar9.info;
    local_278.info = local_298.info;
    local_298 = TVar9;
  }
  else {
    TVar9 = expect(in_stack_fffffffffffffaa0,(TokenKind)((ulong)in_stack_fffffffffffffa98 >> 0x30));
    local_2a8._0_8_ = TVar9._0_8_;
    local_278.kind = local_2a8.kind;
    local_278._2_1_ = local_2a8._2_1_;
    local_278.numFlags.raw = local_2a8.numFlags.raw;
    local_278.rawLen = local_2a8.rawLen;
    local_2a8.info = TVar9.info;
    local_278.info = local_2a8.info;
    local_2a8 = TVar9;
  }
  *(undefined1 *)(in_RDI + 0x1f8) = 1;
  bVar1 = Token::isMissing(&local_278);
  if (bVar1) {
    local_261 = 1;
  }
  else {
    local_2b8 = Token::valueText((Token *)CONCAT44(in_stack_fffffffffffffa24,
                                                   in_stack_fffffffffffffa20));
    directive_00._M_str = (char *)in_stack_fffffffffffffa68;
    directive_00._M_len = (size_t)in_stack_fffffffffffffa60;
    SVar2 = LexerFacts::getDirectiveKind(directive_00,(bool)in_stack_fffffffffffffa5f);
    if (SVar2 != MacroUsage) {
      local_2bc = 0xd0004;
      local_2d0 = Token::range((Token *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30
                                                ));
      range.startLoc._4_2_ = in_stack_fffffffffffffa24.subsystem;
      range.startLoc._6_2_ = in_stack_fffffffffffffa24.code;
      range.startLoc._0_4_ = in_stack_fffffffffffffa20;
      range.endLoc = in_stack_fffffffffffffa28;
      addDiag((Preprocessor *)in_stack_fffffffffffffa18,in_stack_fffffffffffffa34,range);
      local_261 = 1;
    }
    bVar1 = peek((Preprocessor *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                 in_stack_fffffffffffffa18._6_2_);
    if (bVar1) {
      local_2e8 = Token::rawText((Token *)CONCAT44(in_stack_fffffffffffffa24,
                                                   in_stack_fffffffffffffa20));
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_2e8);
      local_539 = false;
      if (!bVar1) {
        local_2f8 = Token::rawText((Token *)CONCAT44(in_stack_fffffffffffffa24,
                                                     in_stack_fffffffffffffa20));
        pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_2f8,0);
        local_539 = *pvVar4 == '\\';
      }
      local_2d1 = local_539;
      local_318 = peek((Preprocessor *)in_stack_fffffffffffffa18);
      local_308 = Token::trivia((Token *)CONCAT44(in_stack_fffffffffffffa34,
                                                  in_stack_fffffffffffffa30));
      bVar1 = std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::empty
                        ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x61ff5f);
      if (!bVar1) {
        if (((local_2d1 & 1U) == 0) ||
           (sVar3 = std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::size
                              ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)
                               0x61ff82), sVar3 != 1)) goto LAB_0062002f;
        std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::operator[](&local_308,0);
        local_328 = Trivia::getRawText((Trivia *)in_stack_fffffffffffffa10);
        local_338 = sv((char *)in_stack_fffffffffffffa10,(size_t)in_stack_fffffffffffffa08);
        __x._M_str = (char *)in_stack_fffffffffffffa40;
        __x._M_len = in_stack_fffffffffffffa38;
        __y._M_str._0_4_ = in_stack_fffffffffffffa30;
        __y._M_len = (size_t)in_stack_fffffffffffffa28;
        __y._M_str._4_4_ = in_stack_fffffffffffffa34;
        bVar1 = std::operator==(__x,__y);
        if (!bVar1) goto LAB_0062002f;
      }
      MacroParser::MacroParser((MacroParser *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
      local_260 = MacroParser::parseFormalArgumentList(this_01);
    }
  }
LAB_0062002f:
  SmallVectorBase<slang::parsing::Token>::clear
            ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffffa10);
  local_359 = 0;
LAB_0062004b:
  do {
    local_370 = peek((Preprocessor *)in_stack_fffffffffffffa18);
    pIVar8 = local_370.info;
    if (local_370.kind == EndOfFile) break;
    if (local_370.kind != LineContinuation) {
      local_381 = 0;
      local_398 = Token::trivia((Token *)CONCAT44(in_stack_fffffffffffffa34,
                                                  in_stack_fffffffffffffa30));
      local_3a0 = &local_398;
      local_3a8._M_current =
           (Trivia *)
           std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::begin
                     ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)
                      in_stack_fffffffffffffa08);
      local_3b0 = (Trivia *)
                  std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::end
                            ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)
                             in_stack_fffffffffffffa18);
      while (bVar1 = __gnu_cxx::
                     operator==<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                               ((__normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                                 *)in_stack_fffffffffffffa10,
                                (__normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                                 *)in_stack_fffffffffffffa08), pIVar8 = extraout_RDX,
            ((bVar1 ^ 0xffU) & 1) != 0) {
        local_3b8 = __gnu_cxx::
                    __normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                    ::operator*(&local_3a8);
        pIVar8 = extraout_RDX_00;
        if (local_3b8->kind == EndOfLine) {
          if ((local_359 & 1) == 0) {
            local_381 = 1;
          }
          else {
            local_359 = 0;
          }
        }
        else if (local_3b8->kind == LineComment) {
          local_3c8 = Trivia::getRawText((Trivia *)in_stack_fffffffffffffa10);
          pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::back(&local_3c8);
          local_359 = *pvVar4 == '\\';
          pIVar8 = extraout_RDX_01;
        }
        else {
          local_359 = 0;
        }
        if ((local_381 & 1) != 0) break;
        __gnu_cxx::
        __normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
        ::operator++(&local_3a8);
      }
      if ((local_381 & 1) != 0) break;
      local_3d8 = consume((Preprocessor *)
                          CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      if (local_370.kind == Identifier) {
        local_3e8 = Token::rawText((Token *)CONCAT44(in_stack_fffffffffffffa24,
                                                     in_stack_fffffffffffffa20));
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_3e8);
        if ((!bVar1) &&
           (pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::back(&local_3e8),
           *pvVar4 == '\\')) {
          peek((Preprocessor *)in_stack_fffffffffffffa18);
          local_3f8 = Token::trivia((Token *)CONCAT44(in_stack_fffffffffffffa34,
                                                      in_stack_fffffffffffffa30));
          bVar1 = std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::empty
                            ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x6202de)
          ;
          if ((!bVar1) &&
             (peVar5 = std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::operator[]
                                 (&local_3f8,0), peVar5->kind == EndOfLine)) {
            local_359 = 1;
            in_stack_fffffffffffffa98 = (Token *)(in_RDI + 0x200);
            in_stack_fffffffffffffa90 =
                 *(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                   **)(in_RDI + 8);
            std::basic_string_view<char,_std::char_traits<char>_>::size(&local_3e8);
            std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                       (size_type)in_stack_fffffffffffffa28,
                       CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
            rawText._M_len._7_1_ = in_stack_fffffffffffffa5f;
            rawText._M_len._0_7_ = in_stack_fffffffffffffa58;
            rawText._M_str = (char *)in_stack_fffffffffffffa60;
            Token::withRawText(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,rawText);
            SmallVectorBase<slang::parsing::Token>::push_back
                      ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffffa10,
                       (Token *)in_stack_fffffffffffffa08);
            in_stack_fffffffffffffaa8 = (DefineDirectiveSyntax *)(in_RDI + 0x200);
            in_stack_fffffffffffffaa0 = *(Preprocessor **)(in_RDI + 8);
            std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span
                      ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x6203e1);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                       (char *)in_stack_fffffffffffffa18);
            Token::location(&local_370);
            std::basic_string_view<char,_std::char_traits<char>_>::size(&local_3e8);
            SourceLocation::operator+<unsigned_long>
                      ((SourceLocation *)in_stack_fffffffffffffa18,
                       (unsigned_long)in_stack_fffffffffffffa10);
            SourceLocation::operator-<int>
                      ((SourceLocation *)in_stack_fffffffffffffa18,
                       (int)((ulong)in_stack_fffffffffffffa10 >> 0x20));
            trivia_00._M_extent._M_extent_value = in_stack_fffffffffffffa70._M_extent_value;
            trivia_00._M_ptr = in_stack_fffffffffffffa68;
            rawText_00._M_str = (char *)in_stack_fffffffffffffa88;
            rawText_00._M_len = (size_t)in_stack_fffffffffffffa80;
            in_stack_fffffffffffffa08 = local_458;
            in_stack_fffffffffffffa10 = local_450;
            Token::Token((Token *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58),
                         (BumpAllocator *)in_stack_fffffffffffffa50,
                         (TokenKind)((ulong)in_stack_fffffffffffffa48 >> 0x30),trivia_00,rawText_00,
                         in_stack_fffffffffffffa60);
            SmallVectorBase<slang::parsing::Token>::push_back
                      ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffffa10,
                       (Token *)in_stack_fffffffffffffa08);
            goto LAB_0062004b;
          }
        }
      }
      SmallVectorBase<slang::parsing::Token>::push_back
                ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffffa10,
                 (Token *)in_stack_fffffffffffffa08);
      goto LAB_0062004b;
    }
    local_359 = 0;
    local_380 = consume((Preprocessor *)
                        CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
    SmallVectorBase<slang::parsing::Token>::push_back
              ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffffa10,
               (Token *)in_stack_fffffffffffffa08);
  } while( true );
  *(undefined1 *)(in_RDI + 0x1f8) = 0;
  SmallVectorBase<slang::parsing::Token>::copy
            ((SmallVectorBase<slang::parsing::Token> *)(in_RDI + 0x200),
             *(EVP_PKEY_CTX **)(in_RDI + 8),(EVP_PKEY_CTX *)pIVar8);
  syntax = BumpAllocator::
           emplace<slang::syntax::DefineDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::MacroFormalArgumentListSyntax*&,std::span<slang::parsing::Token,18446744073709551615ul>>
                     ((BumpAllocator *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                      (Token *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                      in_stack_fffffffffffffa80);
  args_1 = (basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x168);
  _local_4a8 = Token::valueText((Token *)CONCAT44(in_stack_fffffffffffffa24,
                                                  in_stack_fffffffffffffa20));
  local_230 = (SourceLocation)&local_4a8;
  local_228 = args_1;
  local_1d0 = local_230;
  local_1c8 = args_1;
  local_1a8 = local_230;
  local_1a0 = args_1;
  local_1b0 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
              ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                        ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                          *)in_stack_fffffffffffffa10,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffffa08);
  args = local_1a8;
  local_150 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
              ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                              *)in_stack_fffffffffffffa10,(size_t)in_stack_fffffffffffffa08);
  local_158 = local_1b0;
  hash_00 = args_1;
  local_148 = args;
  local_140 = args_1;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_168,local_150);
  do {
    local_170 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_168);
    local_178 = boost::unordered::detail::foa::
                table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                          *)0x62068f);
    local_178 = local_178 + local_170;
    local_17c = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffffa18,(size_t)in_stack_fffffffffffffa10);
    if (local_17c != 0) {
      local_188 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                  ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                              *)0x6206dd);
      local_190 = local_188 + local_170 * 0xf;
      do {
        local_194 = boost::unordered::detail::foa::unchecked_countr_zero(0);
        peVar6 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                 ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                         *)0x620730);
        in_stack_fffffffffffffa58 = SUB87(peVar6,0);
        in_stack_fffffffffffffa5f = (undefined1)((ulong)peVar6 >> 0x38);
        in_stack_fffffffffffffa60 = local_148;
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
        ::
        key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>
                  ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>
                    *)0x62075d);
        bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffffa28,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
        if (bVar1) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>
          ::table_locator(&local_1e8,local_178,local_194,local_190 + local_194);
          goto LAB_00620854;
        }
        local_17c = local_17c - 1 & local_17c;
      } while (local_17c != 0);
    }
    bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffa10,(size_t)in_stack_fffffffffffffa08);
    if (bVar1) {
      memset(&local_1e8,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>
      ::table_locator(&local_1e8);
      goto LAB_00620854;
    }
    bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_168,(size_t)hash_00->_M_str);
  } while (bVar1);
  memset(&local_1e8,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>
  ::table_locator(&local_1e8);
LAB_00620854:
  local_1c0 = boost::unordered::detail::foa::
              table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
              ::make_iterator((locator *)0x620861);
  local_220 = local_1c0.pc_;
  local_218 = local_1c0.p_;
  local_4b8 = boost::unordered::
              unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
              ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                     *)0x6208c5);
  bVar1 = boost::unordered::detail::foa::operator!=
                    ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                      *)in_stack_fffffffffffffa10,
                     (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                      *)in_stack_fffffffffffffa08);
  if (bVar1) {
    ppVar7 = boost::unordered::detail::foa::
             table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
             ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                           *)0x620900);
    if (((ppVar7->second).builtIn & 1U) == 0) {
      ppVar7 = boost::unordered::detail::foa::
               table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
               ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                             *)0x62096e);
      if (((ppVar7->second).commandLine & 1U) == 0) {
        if ((local_261 & 1) == 0) {
          ppVar7 = boost::unordered::detail::foa::
                   table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                   ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                 *)0x62099c);
          bVar1 = MacroDef::valid(&ppVar7->second);
          if (bVar1) {
            this_00 = syntax;
            boost::unordered::detail::foa::
            table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
            ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)0x6209cb);
            bVar1 = isSameMacro(in_stack_fffffffffffffaa8,
                                (DefineDirectiveSyntax *)in_stack_fffffffffffffaa0);
            if (!bVar1) {
              local_4dc = 0x290004;
              local_4f0 = Token::range((Token *)CONCAT44(in_stack_fffffffffffffa34,
                                                         in_stack_fffffffffffffa30));
              range_01.startLoc._4_2_ = in_stack_fffffffffffffa24.subsystem;
              range_01.startLoc._6_2_ = in_stack_fffffffffffffa24.code;
              range_01.startLoc._0_4_ = in_stack_fffffffffffffa20;
              range_01.endLoc = in_stack_fffffffffffffa28;
              in_stack_fffffffffffffa40 =
                   addDiag((Preprocessor *)in_stack_fffffffffffffa18,in_stack_fffffffffffffa34,
                           range_01);
              local_4d8 = in_stack_fffffffffffffa40;
              local_500 = Token::valueText((Token *)CONCAT44(in_stack_fffffffffffffa24,
                                                             in_stack_fffffffffffffa20));
              arg._M_len._7_1_ = in_stack_fffffffffffffa5f;
              arg._M_len._0_7_ = in_stack_fffffffffffffa58;
              arg._M_str = (char *)in_stack_fffffffffffffa60;
              Diagnostic::operator<<((Diagnostic *)this_00,arg);
              local_504 = 0xa0001;
              ppVar7 = boost::unordered::detail::foa::
                       table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                       ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                     *)0x620aa2);
              local_510 = Token::location(&((ppVar7->second).syntax)->name);
              Diagnostic::addNote(in_stack_fffffffffffffa10,in_stack_fffffffffffffa24,
                                  in_stack_fffffffffffffa18);
            }
          }
        }
      }
      else {
        local_261 = 1;
      }
    }
    else {
      local_4bc = 0xd0004;
      local_4d0 = Token::range((Token *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30
                                                ));
      range_00.startLoc._4_2_ = in_stack_fffffffffffffa24.subsystem;
      range_00.startLoc._6_2_ = in_stack_fffffffffffffa24.code;
      range_00.startLoc._0_4_ = in_stack_fffffffffffffa20;
      range_00.endLoc = in_stack_fffffffffffffa28;
      addDiag((Preprocessor *)in_stack_fffffffffffffa18,in_stack_fffffffffffffa34,range_00);
      local_261 = 1;
    }
  }
  if ((local_261 & 1) == 0) {
    MacroDef::MacroDef(&local_520,syntax);
    __x_00 = (basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x168);
    local_530 = Token::valueText((Token *)CONCAT44(in_stack_fffffffffffffa24,
                                                   in_stack_fffffffffffffa20));
    local_1f8 = &local_530;
    local_70 = &local_131;
    uVar10 = SUB84(__x_00,0);
    uVar11 = (undefined4)((ulong)__x_00 >> 0x20);
    local_1f0 = __x_00;
    local_130 = local_1f8;
    local_128 = __x_00;
    local_78 = local_1f8;
    local_68 = __x_00;
    local_80 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
               ::key_from<std::basic_string_view<char,std::char_traits<char>>>(local_1f8);
    local_88 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
               ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                         ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                           *)in_stack_fffffffffffffa10,
                          (basic_string_view<char,_std::char_traits<char>_> *)
                          in_stack_fffffffffffffa08);
    local_90 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
               ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                               *)in_stack_fffffffffffffa10,(size_t)in_stack_fffffffffffffa08);
    pos0_00 = CONCAT44(uVar11,uVar10);
    local_10 = local_80;
    local_20 = local_88;
    local_18 = local_90;
    local_8 = pos0_00;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_90);
    do {
      local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
      local_40 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                 ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                           *)0x620c6d);
      local_40 = local_40 + local_38;
      local_44 = boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match
                           ((group15<boost::unordered::detail::foa::plain_integral> *)
                            in_stack_fffffffffffffa18,(size_t)in_stack_fffffffffffffa10);
      if (local_44 != 0) {
        local_50 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                   ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                               *)0x620cb8);
        local_58 = local_50 + local_38 * 0xf;
        do {
          local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
          in_stack_fffffffffffffa18 =
               (SourceLocation)
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
               ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                       *)0x620d08);
          in_stack_fffffffffffffa20 = SUB84(local_10,0);
          in_stack_fffffffffffffa24 = SUB84((ulong)local_10 >> 0x20,0);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
          ::
          key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>
                    ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>
                      *)0x620d35);
          bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                            ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                             CONCAT44(uVar11,uVar10),__x_00,
                             (basic_string_view<char,_std::char_traits<char>_> *)
                             CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>
            ::table_locator(&local_a8,local_40,local_5c,local_58 + local_5c);
            goto LAB_00620e29;
          }
          local_44 = local_44 - 1 & local_44;
        } while (local_44 != 0);
      }
      bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  in_stack_fffffffffffffa10,(size_t)in_stack_fffffffffffffa08);
      if (bVar1) {
        memset(&local_a8,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>
        ::table_locator(&local_a8);
        goto LAB_00620e29;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_30,*(size_t *)(pos0_00 + 8));
    } while (bVar1);
    memset(&local_a8,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>
    ::table_locator(&local_a8);
LAB_00620e29:
    bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                      ((table_locator *)&local_a8);
    if (bVar1) {
      local_b8 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                 ::make_iterator((locator *)0x620e49);
      local_b9 = false;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_210,&local_b8,&local_b9);
    }
    else if (*(ulong *)(CONCAT44(uVar11,uVar10) + 0x28) < *(ulong *)(CONCAT44(uVar11,uVar10) + 0x20)
            ) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                  *)in_stack_fffffffffffffa40,pos0_00,CONCAT44(uVar11,uVar10),
                 (try_emplace_args_t *)__x_00,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      local_d0 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                 ::make_iterator((locator *)0x620ed1);
      local_e9[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_210,&local_d0,local_e9);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                (in_stack_fffffffffffffa90,(size_t)hash_00,(try_emplace_args_t *)args,args_1);
      local_100 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                  ::make_iterator((locator *)0x620f3f);
      local_119[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_210,&local_100,local_119);
    }
    ppVar7 = boost::unordered::detail::foa::
             table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
             ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                           *)0x620f81);
    (ppVar7->second).syntax = local_520.syntax;
    (ppVar7->second).intrinsic = local_520.intrinsic;
    (ppVar7->second).builtIn = local_520.builtIn;
    (ppVar7->second).commandLine = local_520.commandLine;
  }
  Trivia::Trivia(&local_240,Directive,(SyntaxNode *)syntax);
  return local_240;
}

Assistant:

Trivia Preprocessor::handleDefineDirective(Token directive) {
    MacroFormalArgumentListSyntax* formalArguments = nullptr;
    bool bad = false;

    // Next token should be the macro name. We allow the name to be
    // a keyword token for compatibility with other tools.
    Token name;
    if (LF::isKeyword(peek().kind))
        name = consume();
    else
        name = expect(TokenKind::Identifier);

    inMacroBody = true;
    if (name.isMissing())
        bad = true;
    else {
        if (LF::getDirectiveKind(name.valueText(), lexerOptions.enableLegacyProtect) !=
            SyntaxKind::MacroUsage) {
            addDiag(diag::InvalidMacroName, name.range());
            bad = true;
        }

        // Check if this is a function-like macro, which requires an opening paren with no
        // leading space unless the macro name is escaped, in which case we have to allow one space.
        if (peek(TokenKind::OpenParenthesis)) {
            bool isEscaped = !name.rawText().empty() && name.rawText()[0] == '\\';
            auto trivia = peek().trivia();
            if (trivia.empty() ||
                (isEscaped && trivia.size() == 1 && trivia[0].getRawText() == " "sv)) {
                MacroParser parser(*this);
                formalArguments = parser.parseFormalArgumentList();
            }
        }
    }

    // consume all remaining tokens as macro text
    scratchTokenBuffer.clear();
    bool hasContinuation = false;
    while (true) {
        // Figure out when to stop consuming macro text. This involves looking for new lines in the
        // trivia of each token as we grab it. If there's a new line without a preceeding line
        // continuation token we know the macro is finished.
        Token t = peek();
        if (t.kind == TokenKind::EndOfFile)
            break;
        if (t.kind == TokenKind::LineContinuation) {
            hasContinuation = false;
            scratchTokenBuffer.push_back(consume());
            continue;
        }

        bool done = false;
        auto triviaList = t.trivia();
        for (const Trivia& trivia : triviaList) {
            switch (trivia.kind) {
                case TriviaKind::EndOfLine:
                    if (hasContinuation)
                        hasContinuation = false;
                    else
                        done = true;
                    break;
                case TriviaKind::LineComment:
                    // A line comment can have a trailing line continuation.
                    hasContinuation = (trivia.getRawText().back() == '\\');
                    break;
                default:
                    hasContinuation = false;
                    break;
            }
            if (done)
                break;
        }
        if (done)
            break;

        consume();

        if (t.kind == TokenKind::Identifier) {
            // Escaped identifiers that end in a backslash act as a continuation.
            auto raw = t.rawText();
            if (!raw.empty() && raw.back() == '\\') {
                auto nextTrivia = peek().trivia();
                if (!nextTrivia.empty() && nextTrivia[0].kind == TriviaKind::EndOfLine) {
                    hasContinuation = true;
                    scratchTokenBuffer.push_back(
                        t.withRawText(alloc, raw.substr(0, raw.size() - 1)));
                    scratchTokenBuffer.push_back(Token(alloc, TokenKind::LineContinuation, {}, "\\",
                                                       t.location() + raw.size() - 1));
                    continue;
                }
            }
        }

        scratchTokenBuffer.push_back(t);
    }
    inMacroBody = false;

    auto result = alloc.emplace<DefineDirectiveSyntax>(directive, name, formalArguments,
                                                       scratchTokenBuffer.copy(alloc));

    if (auto it = macros.find(name.valueText()); it != macros.end()) {
        if (it->second.builtIn) {
            addDiag(diag::InvalidMacroName, name.range());
            bad = true;
        }
        else if (it->second.commandLine)
            bad = true; // not really bad, but commandLine args has precedence so we skip this
        else if (!bad && it->second.valid() && !isSameMacro(*result, *it->second.syntax)) {
            auto& diag = addDiag(diag::RedefiningMacro, name.range());
            diag << name.valueText();
            diag.addNote(diag::NotePreviousDefinition, it->second.syntax->name.location());
        }
    }

    if (!bad)
        macros[name.valueText()] = result;
    return Trivia(TriviaKind::Directive, result);
}